

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.c
# Opt level: O1

int mj_effect_grayscale(mj_jpeg_t *m)

{
  jpeg_component_info *pjVar1;
  int iVar2;
  JBLOCKARRAY ppaJVar3;
  JDIMENSION JVar4;
  long lVar5;
  
  iVar2 = 2;
  if ((((m != (mj_jpeg_t *)0x0) && (iVar2 = 2, m->coef != (jvirt_barray_ptr *)0x0)) &&
      (iVar2 = 0, (m->cinfo).jpeg_color_space == JCS_YCbCr)) && (1 < (m->cinfo).num_components)) {
    lVar5 = 1;
    do {
      pjVar1 = (m->cinfo).comp_info;
      if (pjVar1[lVar5].height_in_blocks != 0) {
        JVar4 = 0;
        do {
          ppaJVar3 = (*((m->cinfo).mem)->access_virt_barray)
                               ((j_common_ptr)m,m->coef[lVar5],JVar4,1,1);
          if ((ulong)pjVar1[lVar5].width_in_blocks != 0) {
            memset(*ppaJVar3,0,(ulong)pjVar1[lVar5].width_in_blocks << 7);
          }
          JVar4 = JVar4 + 1;
        } while (JVar4 < pjVar1[lVar5].height_in_blocks);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (m->cinfo).num_components);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mj_effect_grayscale(mj_jpeg_t *m) {
    int                  i, c;
    JDIMENSION           k, l;
    jpeg_component_info *component;
    JBLOCKARRAY          blocks;
    JCOEFPTR             coefs;

    if(m == NULL || m->coef == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    if(m->cinfo.jpeg_color_space != JCS_YCbCr) {
        return MJ_OK;
    }

    /* set all color components to 0 */
    for(c = 1; c < m->cinfo.num_components; c++) {
        component = &m->cinfo.comp_info[c];

        for(l = 0; l < component->height_in_blocks; l++) {
            blocks = (*m->cinfo.mem->access_virt_barray)((j_common_ptr)&m->cinfo, m->coef[c], l, 1, TRUE);

            for(k = 0; k < component->width_in_blocks; k++) {
                coefs = blocks[0][k];

                for(i = 0; i < DCTSIZE2; i += 8) {
                    coefs[i + 0] = 0;
                    coefs[i + 1] = 0;
                    coefs[i + 2] = 0;
                    coefs[i + 3] = 0;
                    coefs[i + 4] = 0;
                    coefs[i + 5] = 0;
                    coefs[i + 6] = 0;
                    coefs[i + 7] = 0;
                }
            }
        }
    }

    return MJ_OK;
}